

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

int __thiscall QParallelAnimationGroup::duration(QParallelAnimationGroup *this)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  lVar1 = *(long *)(*(long *)(this + 8) + 0xb0);
  if (lVar1 == 0) {
    iVar4 = 0;
  }
  else {
    lVar2 = *(long *)(*(long *)(this + 8) + 0xa8);
    lVar5 = 0;
    iVar4 = 0;
    do {
      iVar3 = QAbstractAnimation::totalDuration(*(QAbstractAnimation **)(lVar2 + lVar5));
      if (iVar3 == -1) {
        return -1;
      }
      if (iVar4 <= iVar3) {
        iVar4 = iVar3;
      }
      lVar5 = lVar5 + 8;
    } while (lVar1 << 3 != lVar5);
  }
  return iVar4;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }